

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<short,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long_long lhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  short sVar2;
  undefined2 *in_RDX;
  undefined2 in_SI;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  unsigned_long_long *in_stack_ffffffffffffffb8;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  unsigned_long_long in_stack_ffffffffffffffd8;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffe4;
  undefined2 local_1a;
  
  sVar2 = ::SafeInt::operator_cast_to_short(in_stack_ffffffffffffffc0);
  if (sVar2 < 1) {
    sVar2 = ::SafeInt::operator_cast_to_short(in_stack_ffffffffffffffc0);
    if (sVar2 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<short,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe4,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
                      );
    if (!bVar1) {
      ::SafeInt::operator_cast_to_short(in_stack_ffffffffffffffc0);
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_long_long>(in_stack_ffffffffffffffc0,(unsigned_long_long *)in_RDI);
      *in_RDX = in_stack_ffffffffffffffd4;
    }
  }
  else {
    ::SafeInt::operator_cast_to_short(in_RDI);
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
    SafeInt<unsigned_long_long>(in_RDI,in_stack_ffffffffffffffb8);
    *in_RDX = local_1a;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }